

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UResourceBundle *
icu_63::getZoneByName
          (UResourceBundle *top,UnicodeString *id,UResourceBundle *oldbundle,UErrorCode *status)

{
  UBool UVar1;
  int32_t indexR;
  UResourceBundle *pUStack_38;
  int32_t idx;
  UResourceBundle *tmp;
  UErrorCode *status_local;
  UResourceBundle *oldbundle_local;
  UnicodeString *id_local;
  UResourceBundle *top_local;
  
  pUStack_38 = ures_getByKey_63(top,"Names",(UResourceBundle *)0x0,status);
  indexR = findInStringArray(pUStack_38,id,status);
  if (indexR == -1) {
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      *status = U_MISSING_RESOURCE_ERROR;
      status_local = (UErrorCode *)oldbundle;
      goto LAB_0023b6cd;
    }
  }
  pUStack_38 = ures_getByKey_63(top,"Zones",pUStack_38,status);
  status_local = (UErrorCode *)ures_getByIndex_63(pUStack_38,indexR,oldbundle,status);
LAB_0023b6cd:
  ures_close_63(pUStack_38);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    top_local = (UResourceBundle *)status_local;
  }
  else {
    top_local = (UResourceBundle *)0x0;
  }
  return top_local;
}

Assistant:

static UResourceBundle* getZoneByName(const UResourceBundle* top, const UnicodeString& id, UResourceBundle *oldbundle, UErrorCode& status) {
    // load the Rules object
    UResourceBundle *tmp = ures_getByKey(top, kNAMES, NULL, &status);

    // search for the string
    int32_t idx = findInStringArray(tmp, id, status);

    if((idx == -1) && U_SUCCESS(status)) {
        // not found
        status = U_MISSING_RESOURCE_ERROR;
        //ures_close(oldbundle);
        //oldbundle = NULL;
    } else {
        U_DEBUG_TZ_MSG(("gzbn: oldbundle= size %d, type %d, %s\n", ures_getSize(tmp), ures_getType(tmp), u_errorName(status)));
        tmp = ures_getByKey(top, kZONES, tmp, &status); // get Zones object from top
        U_DEBUG_TZ_MSG(("gzbn: loaded ZONES, size %d, type %d, path %s %s\n", ures_getSize(tmp), ures_getType(tmp), ures_getPath(tmp), u_errorName(status)));
        oldbundle = ures_getByIndex(tmp, idx, oldbundle, &status); // get nth Zone object
        U_DEBUG_TZ_MSG(("gzbn: loaded z#%d, size %d, type %d, path %s, %s\n", idx, ures_getSize(oldbundle), ures_getType(oldbundle), ures_getPath(oldbundle),  u_errorName(status)));
    }
    ures_close(tmp);
    if(U_FAILURE(status)) {
        //ures_close(oldbundle);
        return NULL;
    } else {
        return oldbundle;
    }
}